

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O2

int __thiscall ncnn::Convolution::destroy_pipeline(Convolution *this,Option *opt)

{
  Layer *pLVar1;
  pointer ppLVar2;
  pointer ppLVar3;
  pointer pfVar4;
  int i;
  long lVar5;
  Option opt_cpu;
  undefined4 local_48;
  int iStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  uint uStack_30;
  int iStack_2c;
  undefined8 local_28;
  
  local_48 = *(undefined4 *)opt;
  iStack_44 = opt->num_threads;
  uStack_40 = *(undefined4 *)&opt->blob_allocator;
  uStack_3c = *(undefined4 *)((long)&opt->blob_allocator + 4);
  local_38 = *(undefined4 *)&opt->workspace_allocator;
  uStack_34 = *(undefined4 *)((long)&opt->workspace_allocator + 4);
  iStack_2c = opt->use_winograd_convolution;
  local_28._0_4_ = opt->use_sgemm_convolution;
  local_28._4_4_ = opt->use_int8_inference;
  uStack_30 = *(uint *)&opt->vulkan_compute & 0xffffff00;
  pLVar1 = this->quantize;
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[5])(pLVar1,&local_48);
    if (this->quantize != (Layer *)0x0) {
      (*this->quantize->_vptr_Layer[1])();
    }
    this->quantize = (Layer *)0x0;
  }
  lVar5 = 0;
  while( true ) {
    ppLVar2 = (this->dequantize_ops).
              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppLVar3 = (this->dequantize_ops).
              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)ppLVar3 - (long)ppLVar2) >> 3) <= lVar5) break;
    (*ppLVar2[lVar5]->_vptr_Layer[5])(ppLVar2[lVar5],&local_48);
    pLVar1 = (this->dequantize_ops).
             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
             super__Vector_impl_data._M_start[lVar5];
    if (pLVar1 != (Layer *)0x0) {
      (*pLVar1->_vptr_Layer[1])();
    }
    lVar5 = lVar5 + 1;
  }
  if (ppLVar3 != ppLVar2) {
    (this->dequantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl
    .super__Vector_impl_data._M_finish = ppLVar2;
  }
  lVar5 = 0;
  while( true ) {
    ppLVar2 = (this->requantize_ops).
              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppLVar3 = (this->requantize_ops).
              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)ppLVar3 - (long)ppLVar2) >> 3) <= lVar5) break;
    (*ppLVar2[lVar5]->_vptr_Layer[5])(ppLVar2[lVar5],&local_48);
    pLVar1 = (this->requantize_ops).
             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
             super__Vector_impl_data._M_start[lVar5];
    if (pLVar1 != (Layer *)0x0) {
      (*pLVar1->_vptr_Layer[1])();
    }
    lVar5 = lVar5 + 1;
  }
  if (ppLVar3 != ppLVar2) {
    (this->requantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl
    .super__Vector_impl_data._M_finish = ppLVar2;
  }
  pfVar4 = (this->dequantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->dequantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar4) {
    (this->dequantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar4;
  }
  pfVar4 = (this->requantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->requantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar4) {
    (this->requantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar4;
  }
  return 0;
}

Assistant:

int Convolution::destroy_pipeline(const Option& opt)
{
    Option opt_cpu = opt;
    opt_cpu.vulkan_compute = false;

    if (quantize)
    {
        quantize->destroy_pipeline(opt_cpu);
        delete quantize;
        quantize = 0;
    }

    for (int i=0; i<(int)dequantize_ops.size(); i++)
    {
        dequantize_ops[i]->destroy_pipeline(opt_cpu);
        delete dequantize_ops[i];
    }
    dequantize_ops.clear();

    for (int i=0; i<(int)requantize_ops.size(); i++)
    {
        requantize_ops[i]->destroy_pipeline(opt_cpu);
        delete requantize_ops[i];
    }
    requantize_ops.clear();

    dequantize_scales.clear();
    requantize_scales.clear();

    return 0;
}